

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O3

void __thiscall gpu::Context::Data::~Data(Data *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long in_FS_OFFSET;
  
  if (*(Data **)(in_FS_OFFSET + -8) == this) {
    *(undefined8 *)(in_FS_OFFSET + -8) = 0;
  }
  else if (*(Data **)(in_FS_OFFSET + -8) != (Data *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Another GPU context found on context destruction",0x30);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  this_00 = (this->ocl_engine).super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

Context::Data::~Data()
{
	if (data_current_ != this) {
		if (data_current_ != 0) {
			std::cerr << "Another GPU context found on context destruction" << std::endl;
		}
	} else {
		data_current_ = 0;
	}

#ifdef CUDA_SUPPORT
	if (cuda_stream) {
		cudaError_t err = cudaStreamDestroy(cuda_stream);
		if (cudaSuccess != err)
			std::cerr << "Warning: cudaStreamDestroy failed: " << cuda::formatError(err) << std::endl;
	}

#ifndef CUDA_USE_PRIMARY_CONTEXT
	if (cuda_context) {
		CUresult err = cuCtxDestroy(cuda_context);
		if (CUDA_SUCCESS != err)
			std::cerr << "Warning: cuCtxDestroy failed: " << cuda::formatDriverError(err) << std::endl;
	}
#endif
#endif
}